

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

char * google::GetHex(char *start,char *end,uint64_t *hex)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  *hex = 0;
  if (start < end) {
    uVar2 = 0;
    pbVar3 = (byte *)start;
    do {
      start = (char *)pbVar3;
      bVar1 = *start;
      if ((9 < (byte)(bVar1 - 0x30)) &&
         ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))))
      break;
      uVar4 = (ulong)(((int)(char)bVar1 & 0xfU) + 9);
      if (bVar1 < 0x41) {
        uVar4 = (long)(int)((int)(char)bVar1 - 0x30);
      }
      uVar2 = uVar2 << 4 | uVar4;
      *hex = uVar2;
      pbVar3 = (byte *)start + 1;
      start = end;
    } while (pbVar3 != (byte *)end);
  }
  if (end < start) {
    abort();
  }
  return (char *)(byte *)start;
}

Assistant:

static char* GetHex(const char* start, const char* end, uint64_t* hex) {
  *hex = 0;
  const char* p;
  for (p = start; p < end; ++p) {
    int ch = *p;
    if ((ch >= '0' && ch <= '9') || (ch >= 'A' && ch <= 'F') ||
        (ch >= 'a' && ch <= 'f')) {
      *hex = (*hex << 4U) |
             (ch < 'A' ? static_cast<uint64_t>(ch - '0') : (ch & 0xF) + 9U);
    } else {  // Encountered the first non-hex character.
      break;
    }
  }
  GLOG_SAFE_ASSERT(p <= end);
  return const_cast<char*>(p);
}